

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

void Cmf_CreateOptions_rec(Vec_Wec_t *vPars,int iPar,char (*Argv) [20],int Argc,Vec_Ptr_t *vOpts)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  satoko_opts_t *psVar6;
  void **ppvVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  char (*__s) [20];
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char *pArgv [100];
  char *local_358;
  long alStack_350 [100];
  
  if (Argc < 0x65) {
    lVar9 = (long)Argc;
    uVar11 = (ulong)(uint)iPar << 4 | 8;
    lVar13 = lVar9 << 0x20;
    __s = Argv + lVar9;
    lVar14 = 0;
    do {
      if ((ulong)(uint)iPar + lVar14 == (ulong)(uint)vPars->nSize) {
        if (0 < lVar9 + lVar14) {
          uVar11 = (ulong)(uint)Argc + lVar14 & 0xffffffff;
          lVar9 = uVar11 - 1;
          auVar15._8_4_ = (int)lVar9;
          auVar15._0_8_ = lVar9;
          auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
          uVar10 = 0;
          auVar15 = auVar15 ^ _DAT_0093d220;
          auVar16 = _DAT_0093d210;
          do {
            auVar17 = auVar16 ^ _DAT_0093d220;
            if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                        auVar15._4_4_ < auVar17._4_4_) & 1)) {
              alStack_350[uVar10 - 1] = (long)Argv;
            }
            if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
                auVar17._12_4_ <= auVar15._12_4_) {
              alStack_350[uVar10] = (long)(Argv + 1);
            }
            uVar10 = uVar10 + 2;
            lVar9 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar9 + 2;
            Argv = Argv + 2;
          } while ((uVar11 + 1 & 0xfffffffffffffffe) != uVar10);
        }
        iVar12 = (int)((ulong)(uint)Argc + lVar14);
        psVar6 = Cmd_DeriveOptionFromSettings(iVar12,&local_358);
        if (psVar6 == (satoko_opts_t *)0x0) {
          puts("Cannot parse command line options...");
        }
        else {
          uVar3 = vOpts->nSize;
          if (uVar3 == vOpts->nCap) {
            if ((int)uVar3 < 0x10) {
              if (vOpts->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vOpts->pArray,0x80);
              }
              vOpts->pArray = ppvVar7;
              vOpts->nCap = 0x10;
            }
            else {
              if (vOpts->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vOpts->pArray,(ulong)uVar3 << 4);
              }
              vOpts->pArray = ppvVar7;
              vOpts->nCap = uVar3 * 2;
            }
          }
          else {
            ppvVar7 = vOpts->pArray;
          }
          iVar2 = vOpts->nSize;
          vOpts->nSize = iVar2 + 1;
          ppvVar7[iVar2] = psVar6;
          pcVar8 = Cmd_DeriveConvertIntoString(iVar12,&local_358);
          uVar3 = vOpts->nSize;
          if (uVar3 == vOpts->nCap) {
            if ((int)uVar3 < 0x10) {
              if (vOpts->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vOpts->pArray,0x80);
              }
              vOpts->pArray = ppvVar7;
              vOpts->nCap = 0x10;
            }
            else {
              if (vOpts->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vOpts->pArray,(ulong)uVar3 << 4);
              }
              vOpts->pArray = ppvVar7;
              vOpts->nCap = uVar3 * 2;
            }
          }
          else {
            ppvVar7 = vOpts->pArray;
          }
          iVar12 = vOpts->nSize;
          vOpts->nSize = iVar12 + 1U;
          ppvVar7[iVar12] = pcVar8;
          if ((long)iVar12 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
          }
          printf("Adding settings %s\n",vOpts->pArray[(ulong)(iVar12 + 1U) - 1]);
        }
        return;
      }
      if ((iPar < 0) || (iVar12 = (int)lVar14, vPars->nSize <= iPar + iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar4 = vPars->pArray;
      iVar2 = *(int *)((long)pVVar4 + (uVar11 - 4));
      if (iVar2 != 2) {
        if (iVar2 < 2) {
          return;
        }
        lVar9 = 1;
        do {
          lVar14 = *(long *)((long)&pVVar4->nCap + uVar11);
          fVar1 = *(float *)(lVar14 + lVar9 * 4);
          if (fVar1 < 0.0) {
            __assert_fail("NumF >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                          ,0x1f1,
                          "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)"
                         );
          }
          sprintf(Argv[lVar13 >> 0x20],"-%c",(ulong)*(uint *)(lVar14 + -4 + lVar9 * 4));
          if ((fVar1 != (float)(int)fVar1) || (NAN(fVar1) || NAN((float)(int)fVar1))) {
            sprintf(Argv[(lVar13 >> 0x20) + 1],"%.3f",(double)fVar1);
          }
          else {
            sprintf(Argv[(lVar13 >> 0x20) + 1],"%d",(ulong)(uint)(int)fVar1);
          }
          Cmf_CreateOptions_rec(vPars,iPar + iVar12 + 1,Argv,Argc + iVar12 + 2,vOpts);
          lVar9 = lVar9 + 2;
        } while ((int)lVar9 < *(int *)((long)pVVar4 + (uVar11 - 4)));
        return;
      }
      puVar5 = *(uint **)((long)&pVVar4->nCap + uVar11);
      fVar1 = (float)puVar5[1];
      if ((fVar1 != -1.0) || (NAN(fVar1))) {
        __assert_fail("Abc_Int2Float(Num) == -1.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0x1e4,
                      "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)"
                     );
      }
      uVar3 = *puVar5;
      Cmf_CreateOptions_rec(vPars,iPar + iVar12 + 1,Argv,Argc + iVar12,vOpts);
      sprintf(*__s,"-%c",(ulong)uVar3);
      lVar14 = lVar14 + 1;
      uVar11 = uVar11 + 0x10;
      lVar13 = lVar13 + 0x100000000;
      __s = __s + 1;
    } while (Argc + iVar12 != 100);
  }
  __assert_fail("Argc <= CMD_AUTO_ARG_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                ,0x1cc,
                "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
}

Assistant:

void Cmf_CreateOptions_rec( Vec_Wec_t * vPars, int iPar, char Argv[CMD_AUTO_ARG_MAX][20], int Argc, Vec_Ptr_t * vOpts )
{
    Vec_Int_t * vLine;
    int Symb, Num, i;
    assert( Argc <= CMD_AUTO_ARG_MAX );
    if ( Vec_WecSize(vPars) == iPar )
    {
        satoko_opts_t * pOpts;
        char * pArgv[CMD_AUTO_ARG_MAX];
        for ( i = 0; i < Argc; i++ )
            pArgv[i] = Argv[i];
        pOpts = Cmd_DeriveOptionFromSettings( Argc, pArgv );
        if ( pOpts == NULL )
            printf( "Cannot parse command line options...\n" );
        else
        {
            Vec_PtrPush( vOpts, pOpts );
            Vec_PtrPush( vOpts, Cmd_DeriveConvertIntoString(Argc, pArgv) );
            printf( "Adding settings %s\n", (char *)Vec_PtrEntryLast(vOpts) );
        }
        return;
    }
    vLine = Vec_WecEntry( vPars, iPar );
    // consider binary option
    if ( Vec_IntSize(vLine) == 2 )
    {
        Symb = Vec_IntEntry( vLine, 0 );
        Num = Vec_IntEntry( vLine, 1 );
        assert( Abc_Int2Float(Num) == -1.0 );
        // create one setting without this option
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc, vOpts );
        // create another setting with this option
        sprintf( Argv[Argc], "-%c", Symb );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+1, vOpts );
        return;
    }
    // consider numeric option
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        // create setting with this option
        assert( NumF >= 0 );
        sprintf( Argv[Argc], "-%c", Symb );
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc+1], "%d", (int)NumF );
        else
            sprintf( Argv[Argc+1], "%.3f", NumF );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+2, vOpts );
    }
}